

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

void __thiscall Quat4f::setAxisAngle(Quat4f *this,float radians,Vector3f *axis)

{
  int __x;
  float fVar1;
  float extraout_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  float reciprocalVectorNorm;
  float vectorNorm;
  float sinHalfTheta;
  Vector3f *axis_local;
  float radians_local;
  Quat4f *this_local;
  
  __x = (int)axis;
  dVar4 = cos((double)(radians / 2.0));
  this->m_elements[0] = (float)dVar4;
  dVar4 = sin((double)(radians / 2.0));
  fVar1 = (float)dVar4;
  Vector3f::abs(axis,__x);
  fVar2 = 1.0 / extraout_XMM0_Da;
  fVar3 = Vector3f::x(axis);
  this->m_elements[1] = fVar3 * fVar1 * fVar2;
  fVar3 = Vector3f::y(axis);
  this->m_elements[2] = fVar3 * fVar1 * fVar2;
  fVar3 = Vector3f::z(axis);
  this->m_elements[3] = fVar3 * fVar1 * fVar2;
  return;
}

Assistant:

void Quat4f::setAxisAngle( float radians, const Vector3f& axis )
{
	m_elements[ 0 ] = cos( radians / 2 );

	float sinHalfTheta = sin( radians / 2 );
	float vectorNorm = axis.abs();
	float reciprocalVectorNorm = 1.f / vectorNorm;

	m_elements[ 1 ] = axis.x() * sinHalfTheta * reciprocalVectorNorm;
	m_elements[ 2 ] = axis.y() * sinHalfTheta * reciprocalVectorNorm;
	m_elements[ 3 ] = axis.z() * sinHalfTheta * reciprocalVectorNorm;
}